

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall olc::PixelGameEngine::pgex_Register(PixelGameEngine *this,PGEX *pgex)

{
  bool bVar1;
  __normal_iterator<olc::PGEX_**,_std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>_> local_38;
  PGEX **local_30;
  __normal_iterator<olc::PGEX_**,_std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>_> local_28;
  __normal_iterator<olc::PGEX_**,_std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>_> local_20;
  PGEX *local_18;
  PGEX *pgex_local;
  PixelGameEngine *this_local;
  
  local_18 = pgex;
  pgex_local = (PGEX *)this;
  local_28._M_current =
       (PGEX **)std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>::begin(&this->vExtensions);
  local_30 = (PGEX **)std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>::end
                                (&this->vExtensions);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<olc::PGEX**,std::vector<olc::PGEX*,std::allocator<olc::PGEX*>>>,olc::PGEX*>
                       (local_28,(__normal_iterator<olc::PGEX_**,_std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>_>
                                  )local_30,&local_18);
  local_38._M_current =
       (PGEX **)std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>::end(&this->vExtensions);
  bVar1 = __gnu_cxx::operator==(&local_20,&local_38);
  if (bVar1) {
    std::vector<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>::push_back(&this->vExtensions,&local_18);
  }
  return;
}

Assistant:

void PixelGameEngine::pgex_Register(olc::PGEX *pgex)
	{
		if (std::find(vExtensions.begin(), vExtensions.end(), pgex) == vExtensions.end())
			vExtensions.push_back(pgex);
	}